

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

ServiceDescriptor * __thiscall
google::protobuf::anon_unknown_23::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocateArray<google::protobuf::ServiceDescriptor>
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,int array_size)

{
  bool bVar1;
  int v1;
  int v2;
  size_t sVar2;
  IntT<char> *pIVar3;
  LogMessage *pLVar4;
  undefined1 auVar5 [16];
  LogMessageFatal local_78 [23];
  Voidify local_61;
  string *local_60;
  string *absl_log_internal_check_op_result;
  ServiceDescriptor *res;
  int *used;
  TypeToUse **data;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [18];
  Voidify local_16;
  undefined1 local_15;
  int local_14;
  bool trivial;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pFStack_10;
  int array_size_local;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  
  local_15 = 1;
  local_14 = array_size;
  pFStack_10 = this;
  bVar1 = has_allocated(this);
  data._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"has_allocated()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,0x195,local_38._M_len,local_38._M_str);
    data._7_1_ = 1;
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_16,pLVar4);
  }
  if ((data._7_1_ & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  used = (int *)TypeMap<google::protobuf::(anonymous_namespace)::PointerT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::Get<char>(&this->pointers_);
  res = (ServiceDescriptor *)
        TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::Get<char>(&this->used_);
  absl_log_internal_check_op_result = (string *)(*(long *)used + (long)*(int *)res);
  sVar2 = RoundUpTo<8>((long)local_14 << 6);
  *(int *)res = *(int *)res + (int)sVar2;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue(*(int *)res);
  pIVar3 = TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::Get<char>(&this->total_);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(*pIVar3);
  local_60 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (v1,v2,"used <= total_.template Get<TypeToUse>()");
  if (local_60 == (string *)0x0) {
    return (ServiceDescriptor *)absl_log_internal_check_op_result;
  }
  auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
             ,0x19b,auVar5._0_8_,auVar5._8_8_);
  pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
}

Assistant:

U* AllocateArray(int array_size) {
    constexpr bool trivial = std::is_trivially_destructible<U>::value;
    using TypeToUse = typename std::conditional<trivial, char, U>::type;

    // We can only allocate after FinalizePlanning has been called.
    ABSL_CHECK(has_allocated());

    TypeToUse*& data = pointers_.template Get<TypeToUse>();
    int& used = used_.template Get<TypeToUse>();
    U* res = reinterpret_cast<U*>(data + used);
    used += trivial ? RoundUpTo<8>(array_size * sizeof(U)) : array_size;
    ABSL_CHECK_LE(used, total_.template Get<TypeToUse>());
    return res;
  }